

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O3

Memslot lookup_usable_reg(void *addr,char *func)

{
  Memslot MVar1;
  char *format;
  
  if (addr == (void *)0x0) {
    __assert_fail("addr != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/bsp.cc"
                  ,0x168,"bsplib::Rdma::Memslot lookup_usable_reg(const void *, const char *)");
  }
  MVar1 = bsplib::Rdma::lookup_reg(s_rdma,addr,false,true);
  if (MVar1 == 0xffffffffffffffff) {
    MVar1 = bsplib::Rdma::lookup_reg(s_rdma,addr,true,false);
    if ((MVar1 == 0xffffffffffffffff) ||
       (((s_rdma->m_used_slots).
         super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>._M_impl
         .super__Vector_impl_data._M_start[(long)s_rdma->m_nprocs * MVar1 + (long)s_spmd->m_pid].
         status & 1) == 0)) {
      format = "%s: Remote address %p was not registered\n";
    }
    else {
      format = 
      "%s: Remote address was just registered  with a bsp_push_reg(%p), but it hasn\'t become effective yet,  because bsp_sync() hasn\'t been performed yet\n"
      ;
    }
    bsp_abort(format,func,addr);
  }
  if (MVar1 != 0xfffffffffffffffe) {
    return MVar1;
  }
  __assert_fail("id != s_rdma->null_slot()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/bsp.cc"
                ,0x178,"bsplib::Rdma::Memslot lookup_usable_reg(const void *, const char *)");
}

Assistant:

static bsplib::Rdma::Memslot lookup_usable_reg( const void * addr, const char * func )
{
    assert( addr != NULL );

    bsplib::Rdma::Memslot id = 
        s_rdma->lookup_reg( const_cast<void*>(addr), false, true);
    if ( id == s_rdma->no_slot() ) {
        id = s_rdma->lookup_reg( addr, true, false );
        unsigned PUSHED = bsplib::Rdma::Memblock::PUSHED;
        if ( id != s_rdma->no_slot() && 
             ( s_rdma->slot(s_spmd->pid(), id).status & PUSHED) )
          bsp_abort("%s: Remote address was just registered "
                 " with a bsp_push_reg(%p), but it hasn't become effective yet, "
                " because bsp_sync() hasn't been performed yet\n", func, addr);
        else
          bsp_abort("%s: Remote address %p was not registered\n", func, addr );
    }

    assert( id != s_rdma->null_slot() );

    return id;
}